

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectOutline.cpp
# Opt level: O1

void __thiscall
Rml::FontEffectOutlineInstancer::~FontEffectOutlineInstancer(FontEffectOutlineInstancer *this)

{
  ~FontEffectOutlineInstancer(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

SharedPtr<FontEffect> FontEffectOutlineInstancer::InstanceFontEffect(const String& /*name*/, const PropertyDictionary& properties)
{
	float width = properties.GetProperty(id_width)->Get<float>();
	Colourb color = properties.GetProperty(id_color)->Get<Colourb>();

	auto font_effect = MakeShared<FontEffectOutline>();
	if (font_effect->Initialise(int(width)))
	{
		font_effect->SetColour(color);
		return font_effect;
	}

	return nullptr;
}